

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

void test_handshake(ptls_iovec_t ticket,int mode,int expect_ticket,int check_ch,
                   int require_client_authentication)

{
  char *pcVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  bool bVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  ptls_context_t *ppVar18;
  int iVar19;
  ptls_t *ppVar20;
  ptls_t *tls;
  undefined8 extraout_RAX;
  undefined7 uVar21;
  undefined8 uVar22;
  uint uVar23;
  int iVar24;
  ulong uVar25;
  size_t sVar26;
  size_t sVar27;
  bool bVar28;
  bool bVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  size_t consumed;
  ptls_buffer_t cbuf;
  ptls_buffer_t decbuf;
  size_t max_early_data_size;
  ptls_handshake_properties_t server_hs_prop;
  uint8_t decbuf_small [16384];
  uint8_t sbuf_small [16384];
  uint8_t cbuf_small [16384];
  size_t local_c1e0;
  int local_c1d4;
  ptls_t *local_c1d0;
  undefined4 local_c1c4;
  undefined4 local_c1c0;
  int local_c1bc;
  undefined1 local_c1b8 [16];
  undefined1 local_c1a8 [16];
  undefined1 local_c198 [16];
  undefined1 local_c188 [16];
  int local_c174;
  ulong local_c170;
  undefined1 local_c168 [16];
  undefined1 local_c158 [16];
  ulong local_c140;
  undefined1 local_c138 [44];
  byte bStack_c10c;
  undefined3 uStack_c10b;
  char *local_c108;
  size_t sStack_c100;
  undefined1 local_c0f8 [16];
  uint8_t *local_c0e8;
  size_t sStack_c0e0;
  undefined1 local_c0d8 [16];
  undefined1 local_c0c8 [16];
  undefined1 local_c0b8 [96];
  undefined1 local_c058 [16];
  undefined1 local_c048 [16];
  undefined1 local_c038 [16384];
  undefined1 local_8038 [16384];
  undefined1 local_4038 [16392];
  
  ppVar18 = ctx;
  local_c158._12_4_ = SUB84(local_c158._0_8_,4);
  local_c188._12_4_ = SUB84(local_c188._0_8_,4);
  local_c1a8._12_4_ = SUB84(local_c1a8._0_8_,4);
  uVar25 = (ulong)(uint)mode;
  local_c0c8 = (undefined1  [16])0x0;
  local_c0d8 = (undefined1  [16])0x0;
  local_c0e8 = (uint8_t *)0x0;
  sStack_c0e0 = 0;
  local_c0f8 = (undefined1  [16])0x0;
  local_c108 = (char *)0x0;
  sStack_c100 = 0;
  stack0xffffffffffff3ee8 = (undefined1  [16])0x0;
  local_c138._0_8_ = (ptls_iovec_t *)0x0;
  local_c138._8_8_ = 0;
  local_c048 = (undefined1  [16])0x0;
  local_c058 = (undefined1  [16])0x0;
  local_c0b8._80_8_ = (uint8_t *)0x0;
  local_c0b8._88_8_ = 0;
  local_c0b8._64_16_ = (undefined1  [16])0x0;
  local_c0b8._48_8_ = (uint8_t *)0x0;
  local_c0b8._56_8_ = 0;
  local_c0b8._32_16_ = (undefined1  [16])0x0;
  local_c0b8._16_8_ = (uint8_t *)0x0;
  local_c0b8._24_8_ = 0;
  local_c0b8._0_8_ = (ptls_iovec_t *)0x0;
  local_c0b8._8_8_ = 0;
  local_c140 = 0;
  if (check_ch != 0) {
    ctx->verify_certificate = verify_certificate;
  }
  local_c1d4 = require_client_authentication;
  local_c1bc = check_ch;
  local_c138._16_16_ = (undefined1  [16])ticket;
  ppVar20 = ptls_new(ppVar18,0);
  tls = ptls_new(ctx_peer,1);
  local_c1b8._8_8_ = 0x4000;
  local_c1b8._0_8_ = local_4038;
  local_c1a8._0_12_ = ZEXT812(0);
  local_c198._8_8_ = 0x4000;
  local_c198._0_8_ = local_8038;
  local_c188._0_12_ = ZEXT812(0);
  local_c168._8_8_ = 0x4000;
  local_c168._0_8_ = local_c038;
  local_c158._0_12_ = ZEXT812(0);
  if (local_c1bc != 0) {
    ctx_peer->on_client_hello = &test_handshake::cb;
    local_c138._8_8_ = 2;
    local_c138._0_8_ = test_handshake::protocols;
    ptls_set_server_name(ppVar20,"test.example.com",0);
  }
  ppVar18 = ctx_peer;
  ctx_peer->on_extension = &test_handshake::cb_1;
  if (local_c1d4 != 0) {
    ppVar18->field_0x68 = ppVar18->field_0x68 | 8;
  }
  if (ppVar18->esni != (ptls_esni_context_t **)0x0) {
    was_esni = 0;
    sStack_c100 = 0x67;
    local_c108 = anon_var_dwarf_dfb5;
  }
  local_c174 = expect_ticket;
  if (mode == 4) {
    if (ppVar18->max_early_data_size == 0) {
      __assert_fail("ctx_peer->max_early_data_size != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0x24f,"void test_handshake(ptls_iovec_t, int, int, int, int)");
    }
    local_c138._32_8_ = &local_c140;
  }
  else if (mode == 3) {
    bStack_c10c = bStack_c10c | 1;
    local_c0b8._72_8_ = "0123456789abcdef0123456789abcdef0123456789abcdef";
    local_c058[0] = local_c058[0] | 2;
  }
  else if (mode == 2) {
    bStack_c10c = bStack_c10c | 1;
  }
  iVar19 = ptls_handshake(ppVar20,(ptls_buffer_t *)local_c1b8,(void *)0x0,(size_t *)0x0,
                          (ptls_handshake_properties_t *)local_c138);
  _ok((uint)(iVar19 == 0x202),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",599);
  _ok((uint)(local_c1a8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",600);
  local_c1d0 = ppVar20;
  local_c170 = uVar25;
  if (mode - 1U < 3) {
    local_c1e0 = local_c1a8._0_8_;
    iVar19 = ptls_handshake(tls,(ptls_buffer_t *)local_c198,(void *)local_c1b8._0_8_,&local_c1e0,
                            (ptls_handshake_properties_t *)local_c0b8);
    if (mode == 3) {
      _ok((uint)(iVar19 == 0x206),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x263);
      ptls_free(tls);
      tls = ptls_new(ctx_peer,1);
    }
    else {
      _ok((uint)(iVar19 == 0x202),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x267);
    }
    _ok((uint)(local_c1a8._0_8_ == local_c1e0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x269);
    _ok((uint)(local_c188._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x26a);
    auVar2._8_8_ = 0;
    auVar2._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar2 << 0x40;
    local_c1e0 = local_c188._0_8_;
    iVar19 = ptls_handshake(local_c1d0,(ptls_buffer_t *)local_c1b8,(void *)local_c198._0_8_,
                            &local_c1e0,(ptls_handshake_properties_t *)local_c138);
    _ok((uint)(iVar19 == 0x202),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x270);
    _ok((uint)(local_c188._0_8_ == local_c1e0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x271);
    _ok((uint)(local_c1a8._0_8_ != 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x272);
    auVar3._8_8_ = 0;
    auVar3._0_8_ = local_c188._8_8_;
    local_c188 = auVar3 << 0x40;
LAB_0011c865:
    local_c1e0 = local_c1a8._0_8_;
    local_c1c4 = (undefined4)CONCAT71(local_c1a8._1_7_,local_c1d4 == 1);
    bVar5 = false;
    local_c1c0 = 0;
  }
  else {
    if (mode != 4) goto LAB_0011c865;
    bVar5 = false;
    _ok((uint)(local_c140 == ctx_peer->max_early_data_size),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x276);
    iVar19 = ptls_send(ppVar20,(ptls_buffer_t *)local_c1b8,"GET / HTTP/1.0\r\n\r\n",0x12);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x278);
    local_c1e0 = local_c1a8._0_8_;
    local_c1c0 = (undefined4)CONCAT71(local_c1a8._1_7_,1);
    if (local_c1d4 == 1) {
      _ok(1,"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x27e);
      bVar5 = true;
      uVar21 = (undefined7)((ulong)extraout_RAX >> 8);
      local_c1c4 = (undefined4)CONCAT71(uVar21,1);
      local_c1c0 = (undefined4)CONCAT71(uVar21,1);
    }
    else {
      local_c1c4 = 0;
    }
  }
  do {
    iVar19 = ptls_handshake(tls,(ptls_buffer_t *)local_c198,(void *)local_c1b8._0_8_,&local_c1e0,
                            (ptls_handshake_properties_t *)local_c0b8);
    bVar28 = iVar19 == 0x202;
    if (!bVar28) break;
  } while ((tls->field_0x160 & 0x20) != 0);
  if ((char)local_c1c4 == '\0') {
    bVar28 = iVar19 == 0;
    uVar22 = 0x289;
  }
  else {
    _ok((uint)((tls->field_0x160 & 2) == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x286);
    uVar22 = 0x287;
  }
  uVar23 = 0;
  _ok((uint)bVar28,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",uVar22);
  _ok((uint)(local_c188._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28c);
  if (local_c1bc == 0) {
    _ok((uint)(tls->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x294);
    bVar28 = tls->negotiated_protocol == (char *)0x0;
    uVar22 = 0x295;
  }
  else {
    _ok((uint)(tls->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28e);
    iVar19 = strcmp(tls->server_name,"test.example.com");
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x28f);
    _ok((uint)(tls->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x290);
    pcVar1 = tls->negotiated_protocol;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar23 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar23,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x291);
    bVar28 = was_esni == (uint)(ctx_peer->esni != (ptls_esni_context_t **)0x0);
    uVar22 = 0x292;
  }
  bVar29 = local_c1d4 == 0;
  _ok((uint)bVar28,"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",uVar22);
  sVar27 = local_c1e0;
  if ((char)local_c1c0 == '\x01' && bVar29) {
    _ok((uint)(local_c1e0 < (ulong)local_c1a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x299);
    memmove((void *)local_c1b8._0_8_,(uint8_t *)(local_c1b8._0_8_ + sVar27),
            local_c1a8._0_8_ - sVar27);
    local_c1e0 = local_c1a8._0_8_ - sVar27;
    local_c1a8._0_8_ = local_c1e0;
    iVar19 = ptls_receive(tls,(ptls_buffer_t *)local_c168,(void *)local_c1b8._0_8_,&local_c1e0);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x29f);
    _ok((uint)(local_c1e0 == local_c1a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a0);
    uVar22 = local_c158._0_8_;
    _ok((uint)(local_c158._0_8_ == 0x12),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a1);
    iVar19 = bcmp((void *)local_c168._0_8_,"GET / HTTP/1.0\r\n\r\n",uVar22);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a2);
    _ok((uint)(tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a3);
    auVar16._8_8_ = 0;
    auVar16._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar16 << 0x40;
    auVar4._8_8_ = 0;
    auVar4._0_8_ = local_c158._8_8_;
    local_c158 = auVar4 << 0x40;
    iVar19 = ptls_send(tls,(ptls_buffer_t *)local_c198,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2a8);
  }
  else {
    if (bVar5) {
      _ok((uint)(local_c1e0 == local_c1a8._0_8_),"%s %d",
          "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ab);
    }
    _ok((uint)(sVar27 == local_c1a8._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ac);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar6 << 0x40;
  }
  ppVar20 = local_c1d0;
  local_c1e0 = local_c188._0_8_;
  uVar23 = 0;
  iVar19 = ptls_handshake(local_c1d0,(ptls_buffer_t *)local_c1b8,(void *)local_c198._0_8_,
                          &local_c1e0,(ptls_handshake_properties_t *)0x0);
  _ok((uint)(iVar19 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b4);
  _ok((uint)(local_c1a8._0_8_ != 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b5);
  if (local_c1bc == 0) {
    _ok((uint)(tls->server_name == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",700);
    _ok((uint)(tls->negotiated_protocol == (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2bd);
    iVar19 = (int)local_c170;
    iVar24 = local_c174;
  }
  else {
    _ok((uint)(ppVar20->server_name != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b7);
    iVar19 = strcmp(ppVar20->server_name,"test.example.com");
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b8);
    _ok((uint)(ppVar20->negotiated_protocol != (char *)0x0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2b9);
    iVar24 = local_c174;
    pcVar1 = ppVar20->negotiated_protocol;
    iVar19 = (int)local_c170;
    if ((*pcVar1 == 'h') && (pcVar1[1] == '2')) {
      uVar23 = (uint)(pcVar1[2] == '\0');
    }
    _ok(uVar23,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ba);
  }
  sVar27 = local_c1e0;
  if (iVar24 == 0) {
    sVar27 = 0;
    _ok((uint)(local_c1e0 == local_c188._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2c5);
  }
  else {
    _ok((uint)(local_c1e0 < (ulong)local_c188._0_8_),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2c1);
    memmove((void *)local_c198._0_8_,(uint8_t *)(local_c198._0_8_ + sVar27),
            local_c188._0_8_ - sVar27);
    sVar27 = local_c188._0_8_ - sVar27;
  }
  local_c188._0_8_ = sVar27;
  if ((char)local_c1c4 == '\0') {
    if (iVar19 == 4) goto LAB_0011d06b;
  }
  else {
    _ok((uint)(tls->state < PTLS_STATE_CLIENT_POST_HANDSHAKE),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ca);
    local_c1e0 = local_c1a8._0_8_;
    iVar19 = ptls_handshake(tls,(ptls_buffer_t *)local_c198,(void *)local_c1b8._0_8_,&local_c1e0,
                            (ptls_handshake_properties_t *)local_c0b8);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2cf);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2d0);
    auVar7._8_8_ = 0;
    auVar7._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar7 << 0x40;
  }
  iVar19 = ptls_send(ppVar20,(ptls_buffer_t *)local_c1b8,"GET / HTTP/1.0\r\n\r\n",0x12);
  _ok((uint)(iVar19 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2d6);
  local_c1e0 = local_c1a8._0_8_;
  iVar19 = ptls_receive(tls,(ptls_buffer_t *)local_c168,(void *)local_c1b8._0_8_,&local_c1e0);
  _ok((uint)(iVar19 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2da);
  _ok((uint)(local_c1e0 == local_c1a8._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2db);
  _ok((uint)(local_c158._0_8_ == 0x12),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2dc);
  auVar30[0] = -(*(uint8_t *)local_c168._0_8_ == 'G');
  auVar30[1] = -(*(uint8_t *)(local_c168._0_8_ + 1) == 'E');
  auVar30[2] = -(*(uint8_t *)(local_c168._0_8_ + 2) == 'T');
  auVar30[3] = -(*(uint8_t *)(local_c168._0_8_ + 3) == ' ');
  auVar30[4] = -(*(uint8_t *)(local_c168._0_8_ + 4) == '/');
  auVar30[5] = -(*(uint8_t *)(local_c168._0_8_ + 5) == ' ');
  auVar30[6] = -(*(uint8_t *)(local_c168._0_8_ + 6) == 'H');
  auVar30[7] = -(*(uint8_t *)(local_c168._0_8_ + 7) == 'T');
  auVar30[8] = -(*(uint8_t *)(local_c168._0_8_ + 8) == 'T');
  auVar30[9] = -(*(uint8_t *)(local_c168._0_8_ + 9) == 'P');
  auVar30[10] = -(*(uint8_t *)(local_c168._0_8_ + 10) == '/');
  auVar30[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0xb) == '1');
  auVar30[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0xc) == '.');
  auVar30[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0xd) == '0');
  auVar30[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0xe) == '\r');
  auVar30[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\n');
  auVar32[0] = -((char)*(undefined2 *)(local_c168._0_8_ + 0x10) == '\r');
  auVar32[1] = -((char)((ushort)*(undefined2 *)(local_c168._0_8_ + 0x10) >> 8) == '\n');
  auVar32[2] = 0xff;
  auVar32[3] = 0xff;
  auVar32[4] = 0xff;
  auVar32[5] = 0xff;
  auVar32[6] = 0xff;
  auVar32[7] = 0xff;
  auVar32[8] = 0xff;
  auVar32[9] = 0xff;
  auVar32[10] = 0xff;
  auVar32[0xb] = 0xff;
  auVar32[0xc] = 0xff;
  auVar32[0xd] = 0xff;
  auVar32[0xe] = 0xff;
  auVar32[0xf] = 0xff;
  auVar32 = auVar32 & auVar30;
  _ok((uint)((ushort)((ushort)(SUB161(auVar32 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar32 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar32 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar32 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar32 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar32 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar32 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar32 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar32 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar32 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar32 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar32 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar32 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar32 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar32 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar32[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2dd);
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < tls->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2de);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_c158._8_8_;
  local_c158 = auVar8 << 0x40;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = local_c1a8._8_8_;
  local_c1a8 = auVar9 << 0x40;
  iVar19 = ptls_send(tls,(ptls_buffer_t *)local_c198,"HTTP/1.0 200 OK\r\n\r\nhello world\n",0x1f);
  _ok((uint)(iVar19 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e3);
LAB_0011d06b:
  local_c1e0 = local_c188._0_8_;
  iVar19 = ptls_receive(ppVar20,(ptls_buffer_t *)local_c168,(void *)local_c198._0_8_,&local_c1e0);
  _ok((uint)(iVar19 == 0),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e8);
  _ok((uint)(local_c1e0 == local_c188._0_8_),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2e9);
  _ok((uint)(local_c158._0_8_ == 0x1f),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ea);
  auVar31[0] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\r');
  auVar31[1] = -(*(uint8_t *)(local_c168._0_8_ + 0x10) == '\n');
  auVar31[2] = -(*(uint8_t *)(local_c168._0_8_ + 0x11) == '\r');
  auVar31[3] = -(*(uint8_t *)(local_c168._0_8_ + 0x12) == '\n');
  auVar31[4] = -(*(uint8_t *)(local_c168._0_8_ + 0x13) == 'h');
  auVar31[5] = -(*(uint8_t *)(local_c168._0_8_ + 0x14) == 'e');
  auVar31[6] = -(*(uint8_t *)(local_c168._0_8_ + 0x15) == 'l');
  auVar31[7] = -(*(uint8_t *)(local_c168._0_8_ + 0x16) == 'l');
  auVar31[8] = -(*(uint8_t *)(local_c168._0_8_ + 0x17) == 'o');
  auVar31[9] = -(*(uint8_t *)(local_c168._0_8_ + 0x18) == ' ');
  auVar31[10] = -(*(uint8_t *)(local_c168._0_8_ + 0x19) == 'w');
  auVar31[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0x1a) == 'o');
  auVar31[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0x1b) == 'r');
  auVar31[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0x1c) == 'l');
  auVar31[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0x1d) == 'd');
  auVar31[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0x1e) == '\n');
  auVar33[0] = -(*(uint8_t *)local_c168._0_8_ == 'H');
  auVar33[1] = -(*(uint8_t *)(local_c168._0_8_ + 1) == 'T');
  auVar33[2] = -(*(uint8_t *)(local_c168._0_8_ + 2) == 'T');
  auVar33[3] = -(*(uint8_t *)(local_c168._0_8_ + 3) == 'P');
  auVar33[4] = -(*(uint8_t *)(local_c168._0_8_ + 4) == '/');
  auVar33[5] = -(*(uint8_t *)(local_c168._0_8_ + 5) == '1');
  auVar33[6] = -(*(uint8_t *)(local_c168._0_8_ + 6) == '.');
  auVar33[7] = -(*(uint8_t *)(local_c168._0_8_ + 7) == '0');
  auVar33[8] = -(*(uint8_t *)(local_c168._0_8_ + 8) == ' ');
  auVar33[9] = -(*(uint8_t *)(local_c168._0_8_ + 9) == '2');
  auVar33[10] = -(*(uint8_t *)(local_c168._0_8_ + 10) == '0');
  auVar33[0xb] = -(*(uint8_t *)(local_c168._0_8_ + 0xb) == '0');
  auVar33[0xc] = -(*(uint8_t *)(local_c168._0_8_ + 0xc) == ' ');
  auVar33[0xd] = -(*(uint8_t *)(local_c168._0_8_ + 0xd) == 'O');
  auVar33[0xe] = -(*(uint8_t *)(local_c168._0_8_ + 0xe) == 'K');
  auVar33[0xf] = -(*(uint8_t *)(local_c168._0_8_ + 0xf) == '\r');
  auVar33 = auVar33 & auVar31;
  _ok((uint)((ushort)((ushort)(SUB161(auVar33 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar33 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB161(auVar33 >> 0x17,0) & 1) << 2 |
                      (ushort)(SUB161(auVar33 >> 0x1f,0) & 1) << 3 |
                      (ushort)(SUB161(auVar33 >> 0x27,0) & 1) << 4 |
                      (ushort)(SUB161(auVar33 >> 0x2f,0) & 1) << 5 |
                      (ushort)(SUB161(auVar33 >> 0x37,0) & 1) << 6 |
                      (ushort)(SUB161(auVar33 >> 0x3f,0) & 1) << 7 |
                      (ushort)(SUB161(auVar33 >> 0x47,0) & 1) << 8 |
                      (ushort)(SUB161(auVar33 >> 0x4f,0) & 1) << 9 |
                      (ushort)(SUB161(auVar33 >> 0x57,0) & 1) << 10 |
                      (ushort)(SUB161(auVar33 >> 0x5f,0) & 1) << 0xb |
                      (ushort)(SUB161(auVar33 >> 0x67,0) & 1) << 0xc |
                      (ushort)(SUB161(auVar33 >> 0x6f,0) & 1) << 0xd |
                      (ushort)(SUB161(auVar33 >> 0x77,0) & 1) << 0xe |
                     (ushort)(byte)(auVar33[0xf] >> 7) << 0xf) == 0xffff),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2eb);
  sVar27 = 0;
  _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar20->state),"%s %d",
      "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ec);
  auVar10._8_8_ = 0;
  auVar10._0_8_ = local_c158._8_8_;
  local_c158 = auVar10 << 0x40;
  auVar17._8_8_ = 0;
  auVar17._0_8_ = local_c188._8_8_;
  local_c188 = auVar17 << 0x40;
  if ((char)local_c1c0 != '\0') {
    local_c1e0 = local_c1a8._0_8_;
    iVar19 = ptls_receive(tls,(ptls_buffer_t *)local_c168,(void *)local_c1b8._0_8_,&local_c1e0);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f3);
    ppVar20 = local_c1d0;
    _ok((uint)(local_c1a8._0_8_ == local_c1e0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f4);
    sVar27 = local_c158._0_8_;
    _ok((uint)(local_c158._0_8_ == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f5);
    _ok((uint)(PTLS_STATE_SERVER_EXPECT_FINISHED < ppVar20->state),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2f6);
    auVar11._8_8_ = 0;
    auVar11._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar11 << 0x40;
  }
  if ((int)local_c170 == 5) {
    ptls_update_key(tls,1);
    _ok(1,"%s %d","/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",
        0x2fd);
    _ok(*(uint *)&tls->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2fe);
    _ok(*(uint *)&tls->field_0x160 >> 4 & 1,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x2ff);
    iVar19 = ptls_send(tls,(ptls_buffer_t *)local_c198,"good bye",8);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x301);
    _ok((uint)((tls->field_0x160 & 8) == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x302);
    _ok((uint)((tls->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x303);
    local_c1e0 = local_c188._0_8_;
    iVar19 = ptls_receive(local_c1d0,(ptls_buffer_t *)local_c168,(void *)local_c198._0_8_,
                          &local_c1e0);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x306);
    _ok((uint)(local_c188._0_8_ == local_c1e0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x307);
    _ok((uint)(local_c158._0_8_ == 8),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x308);
    _ok((uint)(*(long *)local_c168._0_8_ == 0x65796220646f6f67),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x309);
    _ok(*(uint *)&local_c1d0->field_0x160 >> 3 & 1,"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30a);
    _ok((uint)((local_c1d0->field_0x160 & 0x10) == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30b);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_c188._8_8_;
    local_c188 = auVar12 << 0x40;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_c158._8_8_;
    local_c158 = auVar13 << 0x40;
    iVar19 = ptls_send(local_c1d0,(ptls_buffer_t *)local_c1b8,"hello",5);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x30f);
    local_c1e0 = local_c1a8._0_8_;
    iVar19 = ptls_receive(tls,(ptls_buffer_t *)local_c168,(void *)local_c1b8._0_8_,&local_c1e0);
    _ok((uint)(iVar19 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x312);
    _ok((uint)(local_c1a8._0_8_ == local_c1e0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x313);
    _ok((uint)(local_c158._0_8_ == 5),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x314);
    ppVar20 = local_c1d0;
    _ok((uint)((char)*(int *)(local_c168._0_8_ + 4) == 'o' && *(int *)local_c168._0_8_ == 0x6c6c6568
              ),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x315);
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_c1a8._8_8_;
    local_c1a8 = auVar14 << 0x40;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = local_c158._8_8_;
    local_c158 = auVar15 << 0x40;
    sVar27 = 0;
    sVar26 = 0;
  }
  else {
    sVar26 = local_c1a8._0_8_;
  }
  (*ptls_clear_memory)((void *)local_c1b8._0_8_,sVar26);
  if (local_c1a8._8_4_ != 0) {
    free((void *)local_c1b8._0_8_);
  }
  local_c1a8 = (undefined1  [16])0x0;
  local_c1b8 = (undefined1  [16])0x0;
  (*ptls_clear_memory)((void *)local_c198._0_8_,local_c188._0_8_);
  if (local_c188._8_4_ != 0) {
    free((void *)local_c198._0_8_);
  }
  local_c188 = (undefined1  [16])0x0;
  local_c198 = (undefined1  [16])0x0;
  uVar22 = local_c168._0_8_;
  (*ptls_clear_memory)((void *)local_c168._0_8_,sVar27);
  if (local_c158._8_4_ != 0) {
    free((void *)uVar22);
  }
  local_c158 = (undefined1  [16])0x0;
  local_c168 = (undefined1  [16])0x0;
  ptls_free(ppVar20);
  ptls_free(tls);
  if (local_c1bc != 0) {
    ctx_peer->on_client_hello = (ptls_on_client_hello_t *)0x0;
  }
  ctx->verify_certificate = (ptls_verify_certificate_t *)0x0;
  if (local_c1d4 != 0) {
    ctx_peer->field_0x68 = ctx_peer->field_0x68 & 0xf7;
  }
  return;
}

Assistant:

static void test_handshake(ptls_iovec_t ticket, int mode, int expect_ticket, int check_ch, int require_client_authentication)
{
    ptls_t *client, *server;
    ptls_handshake_properties_t client_hs_prop = {{{{NULL}, ticket}}}, server_hs_prop = {{{{NULL}}}};
    uint8_t cbuf_small[16384], sbuf_small[16384], decbuf_small[16384];
    ptls_buffer_t cbuf, sbuf, decbuf;
    size_t consumed, max_early_data_size = 0;
    int ret;
    const char *req = "GET / HTTP/1.0\r\n\r\n";
    const char *resp = "HTTP/1.0 200 OK\r\n\r\nhello world\n";

    if (check_ch)
        ctx->verify_certificate = verify_certificate;

    client = ptls_new(ctx, 0);
    server = ptls_new(ctx_peer, 1);
    ptls_buffer_init(&cbuf, cbuf_small, sizeof(cbuf_small));
    ptls_buffer_init(&sbuf, sbuf_small, sizeof(sbuf_small));
    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    if (check_ch) {
        static ptls_on_client_hello_t cb = {save_client_hello};
        ctx_peer->on_client_hello = &cb;
        static const ptls_iovec_t protocols[] = {{(uint8_t *)"h2", 2}, {(uint8_t *)"http/1.1", 8}};
        client_hs_prop.client.negotiated_protocols.list = protocols;
        client_hs_prop.client.negotiated_protocols.count = sizeof(protocols) / sizeof(protocols[0]);
        ptls_set_server_name(client, "test.example.com", 0);
    }

    static ptls_on_extension_t cb = {on_extension_cb};
    ctx_peer->on_extension = &cb;

    if (require_client_authentication) {
        ctx_peer->require_client_authentication = 1;
    }

    if (ctx_peer->esni != NULL) {
        was_esni = 0;
        client_hs_prop.client.esni_keys = ptls_iovec_init(ESNIKEYS, sizeof(ESNIKEYS) - 1);
    }

    switch (mode) {
    case TEST_HANDSHAKE_HRR:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        break;
    case TEST_HANDSHAKE_HRR_STATELESS:
        client_hs_prop.client.negotiate_before_key_exchange = 1;
        server_hs_prop.server.cookie.key = "0123456789abcdef0123456789abcdef0123456789abcdef";
        server_hs_prop.server.retry_uses_cookie = 1;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        assert(ctx_peer->max_early_data_size != 0);
        client_hs_prop.client.max_early_data_size = &max_early_data_size;
        break;
    }

    msg("client handshake enter 1");
    ret = ptls_handshake(client, &cbuf, NULL, NULL, &client_hs_prop);
    msg("client handshake exit 1");
    ok(ret == PTLS_ERROR_IN_PROGRESS);
    ok(cbuf.off != 0);

    switch (mode) {
    case TEST_HANDSHAKE_2RTT:
    case TEST_HANDSHAKE_HRR:
    case TEST_HANDSHAKE_HRR_STATELESS:
        consumed = cbuf.off;
        msg("server handshake special enter 1");
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake special exit 1");
        if (mode == TEST_HANDSHAKE_HRR_STATELESS) {
            ok(ret == PTLS_ERROR_STATELESS_RETRY);
            ptls_free(server);
            server = ptls_new(ctx_peer, 1);
        } else {
            ok(ret == PTLS_ERROR_IN_PROGRESS);
        }
        ok(cbuf.off == consumed);
        ok(sbuf.off != 0);
        cbuf.off = 0;
        consumed = sbuf.off;
        msg("client handshake special enter 1");
        ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, &client_hs_prop);
        msg("client handshake special exit 1");
        ok(ret == PTLS_ERROR_IN_PROGRESS);
        ok(sbuf.off == consumed);
        ok(cbuf.off != 0);
        sbuf.off = 0;
        break;
    case TEST_HANDSHAKE_EARLY_DATA:
        ok(max_early_data_size == ctx_peer->max_early_data_size);
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);
        break;
    }

    consumed = cbuf.off;
    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 1)
        ok(consumed == cbuf.off);
    do
    {
        msg("server handshake enter 1, consumed: %d", consumed);
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake exit 1, consumed: %d, ret: %d, in_pk: %d", consumed, ret, ptls_handshake_in_private_key(server));
    } while ((ret == PTLS_ERROR_IN_PROGRESS) && (ptls_handshake_in_private_key(server)));
    if (require_client_authentication == 1) {
        ok(ptls_is_psk_handshake(server) == 0);
        ok(ret == PTLS_ERROR_IN_PROGRESS);
    } else {
        ok(ret == 0);
    }

    ok(sbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(server) != NULL);
        ok(strcmp(ptls_get_server_name(server), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(server) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(server), "h2") == 0);
        ok(was_esni == (ctx_peer->esni != NULL));
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 0) {
        ok(consumed < cbuf.off);
        memmove(cbuf.base, cbuf.base + consumed, cbuf.off - consumed);
        cbuf.off -= consumed;

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, decbuf.off) == 0);
        ok(!ptls_handshake_is_complete(server));
        cbuf.off = 0;
        decbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    } else {
        if (mode == TEST_HANDSHAKE_EARLY_DATA && require_client_authentication == 1)
            ok(consumed == cbuf.off);
        ok(consumed == cbuf.off);
        cbuf.off = 0;
    }

    consumed = sbuf.off;
    msg("client handshake enter 2");
    ret = ptls_handshake(client, &cbuf, sbuf.base, &consumed, NULL);
    msg("client handshake exit 2, ret = %d", ret);
    ok(ret == 0);
    ok(cbuf.off != 0);
    if (check_ch) {
        ok(ptls_get_server_name(client) != NULL);
        ok(strcmp(ptls_get_server_name(client), "test.example.com") == 0);
        ok(ptls_get_negotiated_protocol(client) != NULL);
        ok(strcmp(ptls_get_negotiated_protocol(client), "h2") == 0);
    } else {
        ok(ptls_get_server_name(server) == NULL);
        ok(ptls_get_negotiated_protocol(server) == NULL);
    }

    if (expect_ticket) {
        ok(consumed < sbuf.off);
        memmove(sbuf.base, sbuf.base + consumed, sbuf.off - consumed);
        sbuf.off -= consumed;
    } else {
        ok(consumed == sbuf.off);
        sbuf.off = 0;
    }

    if (require_client_authentication == 1) {
        ok(!ptls_handshake_is_complete(server));
        consumed = cbuf.off;
        msg("server handshake special enter 2");
        ret = ptls_handshake(server, &sbuf, cbuf.base, &consumed, &server_hs_prop);
        msg("server handshake special exit 2");
        ok(ret == 0);
        ok(ptls_handshake_is_complete(server));
        cbuf.off = 0;
    }

    if (mode != TEST_HANDSHAKE_EARLY_DATA || require_client_authentication == 1) {
        ret = ptls_send(client, &cbuf, req, strlen(req));
        ok(ret == 0);

        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(consumed == cbuf.off);
        ok(decbuf.off == strlen(req));
        ok(memcmp(decbuf.base, req, strlen(req)) == 0);
        ok(ptls_handshake_is_complete(server));
        decbuf.off = 0;
        cbuf.off = 0;

        ret = ptls_send(server, &sbuf, resp, strlen(resp));
        ok(ret == 0);
    }

    consumed = sbuf.off;
    ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
    ok(ret == 0);
    ok(consumed == sbuf.off);
    ok(decbuf.off == strlen(resp));
    ok(memcmp(decbuf.base, resp, strlen(resp)) == 0);
    ok(ptls_handshake_is_complete(client));
    decbuf.off = 0;
    sbuf.off = 0;

    if (mode == TEST_HANDSHAKE_EARLY_DATA) {
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 0);
        ok(ptls_handshake_is_complete(client));
        cbuf.off = 0;
    }

    if (mode == TEST_HANDSHAKE_KEY_UPDATE) {
        /* server -> client with update_request */
        ret = ptls_update_key(server, 1);
        ok(ret == 0);
        ok(server->needs_key_update);
        ok(server->key_update_send_request);
        ret = ptls_send(server, &sbuf, "good bye", 8);
        ok(ret == 0);
        ok(!server->needs_key_update);
        ok(!server->key_update_send_request);
        consumed = sbuf.off;
        ret = ptls_receive(client, &decbuf, sbuf.base, &consumed);
        ok(ret == 0);
        ok(sbuf.off == consumed);
        ok(decbuf.off == 8);
        ok(memcmp(decbuf.base, "good bye", 8) == 0);
        ok(client->needs_key_update);
        ok(!client->key_update_send_request);
        sbuf.off = 0;
        decbuf.off = 0;
        ret = ptls_send(client, &cbuf, "hello", 5);
        ok(ret == 0);
        consumed = cbuf.off;
        ret = ptls_receive(server, &decbuf, cbuf.base, &consumed);
        ok(ret == 0);
        ok(cbuf.off == consumed);
        ok(decbuf.off == 5);
        ok(memcmp(decbuf.base, "hello", 5) == 0);
        cbuf.off = 0;
        decbuf.off = 0;
    }

    ptls_buffer_dispose(&cbuf);
    ptls_buffer_dispose(&sbuf);
    ptls_buffer_dispose(&decbuf);
    ptls_free(client);
    ptls_free(server);

    if (check_ch)
        ctx_peer->on_client_hello = NULL;

    ctx->verify_certificate = NULL;
    if (require_client_authentication)
        ctx_peer->require_client_authentication = 0;
}